

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLevel2DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,Vec2 *coord,int coordZ,IVec4 *result)

{
  bool bVar1;
  int i_00;
  int j_00;
  int i;
  int c;
  int j;
  int c_00;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec2 vBounds;
  Vec2 uBounds;
  Vector<int,_4> color;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  tcu local_40 [16];
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_48,sampler->normalizedCoords,(access->m_size).m_data[0],
             coord->m_data[0],*(int *)prec,*(int *)(prec + 0xc));
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_50,sampler->normalizedCoords,(access->m_size).m_data[1],
             coord->m_data[1],*(int *)(prec + 4),*(int *)(prec + 0x10));
  fVar2 = floorf(local_48);
  fVar3 = floorf(local_44);
  fVar4 = floorf(local_50);
  fVar5 = floorf(local_4c);
  for (c_00 = (int)fVar4; c = (int)fVar2, c_00 <= (int)fVar5; c_00 = c_00 + 1) {
    while (c <= (int)fVar3) {
      i_00 = TexVerifierUtil::wrap(sampler->wrapS,c,(access->m_size).m_data[0]);
      j_00 = TexVerifierUtil::wrap(sampler->wrapT,c_00,(access->m_size).m_data[1]);
      lookup<int>(local_40,access,sampler,i_00,j_00,coordZ);
      bVar1 = isColorValid(prec,(IVec4 *)local_40,result);
      c = c + 1;
      if (bVar1) goto LAB_0057481d;
    }
  }
LAB_0057481d:
  return c_00 <= (int)fVar5;
}

Assistant:

bool isLevel2DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const Vec2&					coord,
								 const int						coordZ,
								 const IVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coord, coordZ, result);
}